

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_portable_deserialize_frozen(char *buf)

{
  uint uVar1;
  ushort *puVar2;
  roaring_bitmap_t *prVar3;
  void **ppvVar4;
  uint16_t *puVar5;
  uint8_t *puVar6;
  uint *puVar7;
  uint *in_RDI;
  bool bVar8;
  array_container_t *c_2;
  uint16_t n_runs;
  run_container_t *c_1;
  bitset_container_t *c;
  _Bool isrun_1;
  _Bool isbitmap_1;
  int32_t cardinality_1;
  uint16_t tmp_1;
  int32_t i_1;
  uint8_t *typecodes;
  uint16_t *keys;
  roaring_bitmap_t *rb;
  char *arena;
  size_t alloc_size;
  _Bool isrun;
  _Bool isbitmap;
  uint32_t cardinality;
  uint16_t tmp;
  int32_t i;
  int32_t num_array_containers;
  int32_t num_run_containers;
  int32_t num_bitset_containers;
  int32_t run_flag_bitset_size;
  _Bool hasrun;
  char *run_flag_bitset;
  uint32_t *offset_headers;
  uint16_t *descriptive_headers;
  int32_t num_containers;
  uint32_t cookie;
  char *start_of_buf;
  bool local_95;
  int local_8c;
  char *local_70;
  long local_68;
  bool local_5a;
  bool local_59;
  uint local_58;
  ushort local_52;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  uint local_40;
  byte local_39;
  uint *local_38;
  ushort *local_30;
  uint *local_28;
  uint local_20;
  uint local_1c;
  uint *local_18;
  ushort *local_10;
  roaring_bitmap_t *local_8;
  
  local_30 = (ushort *)0x0;
  local_38 = (uint *)0x0;
  local_39 = 0;
  local_1c = *in_RDI;
  puVar7 = in_RDI + 1;
  if (local_1c == 0x303a) {
    local_20 = *puVar7;
    local_28 = in_RDI + 2;
    local_30 = (ushort *)((long)(int)(local_20 << 1) * 2 + (long)local_28);
    local_10 = local_30 + (long)(int)local_20 * 2;
  }
  else {
    if ((local_1c & 0xffff) != 0x303b) {
      return (roaring_bitmap_t *)0x0;
    }
    local_20 = (local_1c >> 0x10) + 1;
    local_39 = 1;
    local_40 = ((local_1c >> 0x10) + 8) / 8;
    local_28 = (uint *)((long)puVar7 + (long)(int)local_40);
    puVar2 = (ushort *)((long)(int)(local_20 * 2) * 2 + (long)local_28);
    local_38 = puVar7;
    local_10 = puVar2;
    if (3 < local_20) {
      local_10 = puVar2 + (long)(int)local_20 * 2;
      local_30 = puVar2;
    }
  }
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  for (local_50 = 0; local_50 < (int)local_20; local_50 = local_50 + 1) {
    local_52 = *(ushort *)((long)local_28 + (long)(local_50 << 1) * 2 + 2);
    local_58 = local_52 + 1;
    local_59 = 0x1000 < local_58;
    local_5a = false;
    if (local_39 != 0) {
      local_5a = ((int)*(char *)((long)local_38 + (long)(local_50 / 8)) &
                 1 << ((byte)((long)local_50 % 8) & 0x1f)) != 0;
      local_59 = !local_5a && local_59;
    }
    if (local_59 == false) {
      if (local_5a == false) {
        local_4c = local_4c + 1;
      }
      else {
        local_48 = local_48 + 1;
      }
    }
    else {
      local_44 = local_44 + 1;
    }
  }
  local_68 = (long)(int)local_20 +
             (long)(int)local_20 * 2 +
             (long)local_4c * 0x10 +
             (long)local_48 * 0x10 + (long)local_44 * 0x10 + (long)(int)local_20 * 8 + 0x28;
  local_18 = in_RDI;
  local_70 = (char *)roaring_malloc(0x1281a3);
  if (local_70 == (char *)0x0) {
    local_8 = (roaring_bitmap_t *)0x0;
  }
  else {
    prVar3 = (roaring_bitmap_t *)arena_alloc(&local_70,0x28);
    (prVar3->high_low_container).flags = '\x02';
    (prVar3->high_low_container).allocation_size = local_20;
    (prVar3->high_low_container).size = local_20;
    ppvVar4 = (void **)arena_alloc(&local_70,(long)(int)local_20 << 3);
    (prVar3->high_low_container).containers = ppvVar4;
    puVar5 = (uint16_t *)arena_alloc(&local_70,(long)(int)local_20 << 1);
    puVar6 = (uint8_t *)arena_alloc(&local_70,(long)(int)local_20);
    (prVar3->high_low_container).keys = puVar5;
    (prVar3->high_low_container).typecodes = puVar6;
    for (local_8c = 0; local_8 = prVar3, local_8c < (int)local_20; local_8c = local_8c + 1) {
      uVar1 = *(ushort *)((long)local_28 + (long)(local_8c << 1) * 2 + 2) + 1;
      local_95 = 0x1000 < uVar1;
      bVar8 = false;
      if ((local_39 & 1) != 0) {
        bVar8 = ((int)*(char *)((long)local_38 + (long)(local_8c / 8)) &
                1 << ((byte)((long)local_8c % 8) & 0x1f)) != 0;
        local_95 = !bVar8 && local_95;
      }
      puVar5[local_8c] = *(uint16_t *)((long)local_28 + (long)(local_8c << 1) * 2);
      if (local_95) {
        puVar6[local_8c] = '\x01';
        puVar7 = (uint *)arena_alloc(&local_70,0x10);
        *puVar7 = uVar1;
        if (local_30 == (ushort *)0x0) {
          *(ushort **)(puVar7 + 2) = local_10;
          local_10 = local_10 + 0x1000;
        }
        else {
          *(ulong *)(puVar7 + 2) = (long)local_18 + (ulong)*(uint *)(local_30 + (long)local_8c * 2);
        }
        (prVar3->high_low_container).containers[local_8c] = puVar7;
      }
      else if (bVar8) {
        puVar6[local_8c] = '\x03';
        puVar7 = (uint *)arena_alloc(&local_70,0x10);
        puVar7[1] = uVar1;
        if (local_30 == (ushort *)0x0) {
          *puVar7 = (uint)*local_10;
          *(ushort **)(puVar7 + 2) = local_10 + 1;
          local_10 = local_10 + 1 + (long)(int)*puVar7 * 2;
        }
        else {
          *puVar7 = (uint)*(ushort *)
                           ((long)local_18 + (ulong)*(uint *)(local_30 + (long)local_8c * 2));
          *(ulong *)(puVar7 + 2) =
               (long)local_18 + (ulong)*(uint *)(local_30 + (long)local_8c * 2) + 2;
        }
        (prVar3->high_low_container).containers[local_8c] = puVar7;
      }
      else {
        puVar6[local_8c] = '\x02';
        puVar7 = (uint *)arena_alloc(&local_70,0x10);
        *puVar7 = uVar1;
        puVar7[1] = uVar1;
        if (local_30 == (ushort *)0x0) {
          *(ushort **)(puVar7 + 2) = local_10;
          local_10 = local_10 + (int)uVar1;
        }
        else {
          *(ulong *)(puVar7 + 2) = (long)local_18 + (ulong)*(uint *)(local_30 + (long)local_8c * 2);
        }
        (prVar3->high_low_container).containers[local_8c] = puVar7;
      }
    }
  }
  return local_8;
}

Assistant:

ALLOW_UNALIGNED
roaring_bitmap_t *roaring_bitmap_portable_deserialize_frozen(const char *buf) {
    char *start_of_buf = (char *)buf;
    uint32_t cookie;
    int32_t num_containers;
    uint16_t *descriptive_headers;
    uint32_t *offset_headers = NULL;
    const char *run_flag_bitset = NULL;
    bool hasrun = false;

    // deserialize cookie
    memcpy(&cookie, buf, sizeof(uint32_t));
    buf += sizeof(uint32_t);
    if (cookie == SERIAL_COOKIE_NO_RUNCONTAINER) {
        memcpy(&num_containers, buf, sizeof(int32_t));
        buf += sizeof(int32_t);
        descriptive_headers = (uint16_t *)buf;
        buf += num_containers * 2 * sizeof(uint16_t);
        offset_headers = (uint32_t *)buf;
        buf += num_containers * sizeof(uint32_t);
    } else if ((cookie & 0xFFFF) == SERIAL_COOKIE) {
        num_containers = (cookie >> 16) + 1;
        hasrun = true;
        int32_t run_flag_bitset_size = (num_containers + 7) / 8;
        run_flag_bitset = buf;
        buf += run_flag_bitset_size;
        descriptive_headers = (uint16_t *)buf;
        buf += num_containers * 2 * sizeof(uint16_t);
        if (num_containers >= NO_OFFSET_THRESHOLD) {
            offset_headers = (uint32_t *)buf;
            buf += num_containers * sizeof(uint32_t);
        }
    } else {
        return NULL;
    }

    // calculate total size for allocation
    int32_t num_bitset_containers = 0;
    int32_t num_run_containers = 0;
    int32_t num_array_containers = 0;

    for (int32_t i = 0; i < num_containers; i++) {
        uint16_t tmp;
        memcpy(&tmp, descriptive_headers + 2 * i + 1, sizeof(tmp));
        uint32_t cardinality = tmp + 1;
        bool isbitmap = (cardinality > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((run_flag_bitset[i / 8] & (1 << (i % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }

        if (isbitmap) {
            num_bitset_containers++;
        } else if (isrun) {
            num_run_containers++;
        } else {
            num_array_containers++;
        }
    }

    size_t alloc_size = 0;
    alloc_size += sizeof(roaring_bitmap_t);
    alloc_size += num_containers * sizeof(container_t *);
    alloc_size += num_bitset_containers * sizeof(bitset_container_t);
    alloc_size += num_run_containers * sizeof(run_container_t);
    alloc_size += num_array_containers * sizeof(array_container_t);
    alloc_size += num_containers * sizeof(uint16_t);  // keys
    alloc_size += num_containers * sizeof(uint8_t);   // typecodes

    // allocate bitmap and construct containers
    char *arena = (char *)roaring_malloc(alloc_size);
    if (arena == NULL) {
        return NULL;
    }

    roaring_bitmap_t *rb =
        (roaring_bitmap_t *)arena_alloc(&arena, sizeof(roaring_bitmap_t));
    rb->high_low_container.flags = ROARING_FLAG_FROZEN;
    rb->high_low_container.allocation_size = num_containers;
    rb->high_low_container.size = num_containers;
    rb->high_low_container.containers = (container_t **)arena_alloc(
        &arena, sizeof(container_t *) * num_containers);

    uint16_t *keys =
        (uint16_t *)arena_alloc(&arena, num_containers * sizeof(uint16_t));
    uint8_t *typecodes =
        (uint8_t *)arena_alloc(&arena, num_containers * sizeof(uint8_t));

    rb->high_low_container.keys = keys;
    rb->high_low_container.typecodes = typecodes;

    for (int32_t i = 0; i < num_containers; i++) {
        uint16_t tmp;
        memcpy(&tmp, descriptive_headers + 2 * i + 1, sizeof(tmp));
        int32_t cardinality = tmp + 1;
        bool isbitmap = (cardinality > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((run_flag_bitset[i / 8] & (1 << (i % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }

        keys[i] = descriptive_headers[2 * i];

        if (isbitmap) {
            typecodes[i] = BITSET_CONTAINER_TYPE;
            bitset_container_t *c = (bitset_container_t *)arena_alloc(
                &arena, sizeof(bitset_container_t));
            c->cardinality = cardinality;
            if (offset_headers != NULL) {
                c->words = (uint64_t *)(start_of_buf + offset_headers[i]);
            } else {
                c->words = (uint64_t *)buf;
                buf += BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            }
            rb->high_low_container.containers[i] = c;
        } else if (isrun) {
            typecodes[i] = RUN_CONTAINER_TYPE;
            run_container_t *c =
                (run_container_t *)arena_alloc(&arena, sizeof(run_container_t));
            c->capacity = cardinality;
            uint16_t n_runs;
            if (offset_headers != NULL) {
                memcpy(&n_runs, start_of_buf + offset_headers[i],
                       sizeof(uint16_t));
                c->n_runs = n_runs;
                c->runs = (rle16_t *)(start_of_buf + offset_headers[i] +
                                      sizeof(uint16_t));
            } else {
                memcpy(&n_runs, buf, sizeof(uint16_t));
                c->n_runs = n_runs;
                buf += sizeof(uint16_t);
                c->runs = (rle16_t *)buf;
                buf += c->n_runs * sizeof(rle16_t);
            }
            rb->high_low_container.containers[i] = c;
        } else {
            typecodes[i] = ARRAY_CONTAINER_TYPE;
            array_container_t *c = (array_container_t *)arena_alloc(
                &arena, sizeof(array_container_t));
            c->cardinality = cardinality;
            c->capacity = cardinality;
            if (offset_headers != NULL) {
                c->array = (uint16_t *)(start_of_buf + offset_headers[i]);
            } else {
                c->array = (uint16_t *)buf;
                buf += cardinality * sizeof(uint16_t);
            }
            rb->high_low_container.containers[i] = c;
        }
    }

    return rb;
}